

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManPrintClasses(Iso_Man_t *p,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  Iso_Obj_t *pIVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Iso_Obj_t *pIVar12;
  
  if (fVerbose != 0) {
    printf("Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n",
           (ulong)(uint)p->nObjs,(ulong)(uint)p->nEntries,(ulong)(uint)p->nClasses,
           (ulong)(uint)p->nSingles);
  }
  if (fVeryVerbose != 0) {
    puts("Non-trivial classes:");
    pVVar4 = p->vClasses;
    if (0 < pVVar4->nSize) {
      lVar10 = 0;
      do {
        pIVar12 = (Iso_Obj_t *)pVVar4->pArray[lVar10];
        printf("%5d : {");
        if (pIVar12 != (Iso_Obj_t *)0x0) {
          pIVar5 = p->pObjs;
          if (pIVar12 <= pIVar5) {
LAB_0063033b:
            __assert_fail("pObj > p->pObjs && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x12d,"int Iso_ObjId(Iso_Man_t *, Iso_Obj_t *)");
          }
          while( true ) {
            if (pIVar5 + p->nObjs <= pIVar12) goto LAB_0063033b;
            lVar9 = ((long)pIVar12 - (long)pIVar5 >> 3) * -0x5555555555555555;
            pVVar4 = p->pAig->vObjs;
            if (pVVar4 == (Vec_Ptr_t *)0x0) {
              pvVar6 = (void *)0x0;
            }
            else {
              uVar8 = (uint)lVar9;
              if (((int)uVar8 < 0) || (pVVar4->nSize <= (int)uVar8)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar6 = pVVar4->pArray[uVar8 & 0x7fffffff];
            }
            if ((*(uint *)((long)pvVar6 + 0x18) & 7) - 7 < 0xfffffffe) {
              printf(" %d");
            }
            else {
              pcVar2 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -"
              ;
              if ((*(ulong *)((long)pvVar6 + 8) & 1) == 0) {
                pcVar2 = 
                "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
              }
              uVar11 = *(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe;
              pcVar3 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -"
              ;
              if ((*(ulong *)((long)pvVar6 + 0x10) & 1) == 0) {
                pcVar3 = 
                "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
              }
              uVar7 = *(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe;
              printf(" %d{%s%d(%d),%s%d(%d)}",lVar9,pcVar2 + 0x4a,(ulong)*(uint *)(uVar11 + 0x24),
                     (ulong)(*(uint *)(uVar11 + 0x1c) & 0xffffff),pcVar3 + 0x4a,
                     (ulong)*(uint *)(uVar7 + 0x24),(ulong)(*(uint *)(uVar7 + 0x1c) & 0xffffff));
            }
            printf("(%d)",(ulong)(*(uint *)pIVar12 & 0x3fffffff));
            iVar1 = pIVar12->iClass;
            if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                            ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
            }
            if (iVar1 == 0) break;
            pIVar5 = p->pObjs;
            pIVar12 = pIVar5 + iVar1;
          }
        }
        puts(" }");
        lVar10 = lVar10 + 1;
        pVVar4 = p->vClasses;
      } while (lVar10 < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Iso_ManPrintClasses( Iso_Man_t * p, int fVerbose, int fVeryVerbose )
{
    int fOnlyCis = 0;
    Iso_Obj_t * pIso, * pTemp;
    int i;

    // count unique objects
    if ( fVerbose )
        printf( "Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n", 
            p->nObjs, p->nEntries, p->nClasses, p->nSingles );

    if ( !fVeryVerbose )
        return;

    printf( "Non-trivial classes:\n" );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        if ( fOnlyCis && pIso->Level > 0 )
            continue;

        printf( "%5d : {", i );
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
        {
            if ( fOnlyCis )
                printf( " %d", Aig_ObjCioId( Iso_AigObj(p, pTemp) ) );
            else
            {
                Aig_Obj_t * pObj = Iso_AigObj(p, pTemp);
                if ( Aig_ObjIsNode(pObj) )
                    printf( " %d{%s%d(%d),%s%d(%d)}", Iso_ObjId(p, pTemp), 
                        Aig_ObjFaninC0(pObj)? "-": "+", Aig_ObjFaninId0(pObj), Aig_ObjLevel(Aig_ObjFanin0(pObj)), 
                        Aig_ObjFaninC1(pObj)? "-": "+", Aig_ObjFaninId1(pObj), Aig_ObjLevel(Aig_ObjFanin1(pObj)) );
                else
                    printf( " %d", Iso_ObjId(p, pTemp) );
            }
            printf( "(%d)", pTemp->Level );
        }        
        printf( " }\n" );
    }
}